

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O3

ConeArgs * __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::CheckNorm2_Pow<mp::ConstraintLocationHelper<mp::BasicConstraintKeeper>>
          (ConeArgs *__return_storage_ptr__,void *this,
          ConstraintLocationHelper<mp::BasicConstraintKeeper> *ci,int res_var)

{
  int *piVar1;
  QuadTerms *this_00;
  double dVar2;
  int iVar3;
  ptr ppVar4;
  pointer pdVar5;
  pointer pdVar6;
  double *pdVar7;
  pointer piVar8;
  pointer piVar9;
  long lVar10;
  reference pCVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double *c;
  double *pdVar17;
  vector<double,_std::allocator<double>_> local_88;
  ArrayRef<double> local_68;
  QuadTerms *local_38;
  
  pCVar11 = std::
            _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>::Container_*>
            ::operator[]((_Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>::Container_*>
                          *)(*this + 0x4528),(long)ci->index_);
  dVar2 = (pCVar11->con_).con_flat_.
          super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
          .params_._M_elems[0];
  if ((dVar2 == 0.5) && (!NAN(dVar2))) {
    iVar3 = (pCVar11->con_).con_flat_.
            super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
            .args_._M_elems[0];
    lVar16 = *this;
    lVar12 = *(long *)(lVar16 + 0x2b0);
    uVar13 = *(long *)(lVar16 + 0x2b8) - lVar12;
    if (iVar3 < (int)(uVar13 >> 4)) {
      lVar15 = (long)iVar3 * 0x10;
      lVar14 = *(long *)(lVar12 + lVar15);
      if (lVar14 != 0) {
        if ((ulong)((long)uVar13 >> 4) <= (ulong)(long)iVar3) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        if (lVar16 + 0x17e0 == lVar14) {
          lVar12 = (long)*(int *)(lVar12 + lVar15 + 8);
          lVar14 = (*(long *)(lVar16 + 0x18c0) - *(long *)(lVar16 + 0x18c8) >> 3) *
                   -0x1041041041041041 + lVar12;
          if (lVar14 == 0) {
            lVar16 = *(long *)(lVar16 + 0x18c0) + lVar12 * 0x1f8;
          }
          else {
            lVar16 = *(long *)(*(long *)(lVar16 + 0x18d8) + lVar14 * 8);
          }
          if ((0.0 <= *(double *)(lVar16 + 0x1e0)) && (*(long *)(lVar16 + 0x38) == 0)) {
            this_00 = (QuadTerms *)(lVar16 + 0xa0);
            lVar14 = *(long *)(lVar16 + 0xb0);
            lVar12 = lVar14 + 1;
            lVar15 = lVar14 << 0x20;
            lVar14 = lVar14 * 0x10 + -0xc;
            do {
              lVar15 = lVar15 + -0x100000000;
              lVar12 = lVar12 + -1;
              if (lVar12 == 0) {
                __return_storage_ptr__->is_from_abs_ = false;
                (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                __return_storage_ptr__->const_term = 0.0;
                __return_storage_ptr__->coef_extra = 0.0;
                (__return_storage_ptr__->res_vars_to_delete_).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start = (pointer)0x0;
                (__return_storage_ptr__->res_vars_to_delete_).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = (pointer)0x0;
                (__return_storage_ptr__->res_vars_to_delete_).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage = (pointer)0x0;
                QuadTerms::unfold_if_need(this_00);
                local_68.data_ = *(double **)(lVar16 + 0x138);
                local_68.size_ = *(size_t *)(lVar16 + 0x148);
                local_68.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_68.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_68.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ArrayRef<double>::move_or_copy(&local_88,&local_68);
                pdVar5 = (__return_storage_ptr__->coefs_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar6 = (__return_storage_ptr__->coefs_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
                (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if ((pdVar5 != (pointer)0x0) &&
                   (operator_delete(pdVar5,(long)pdVar6 - (long)pdVar5),
                   local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0)) {
                  operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_88.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_88.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                local_38 = this_00;
                if (local_68.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_68.save_.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_68.save_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_68.save_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                pdVar7 = (__return_storage_ptr__->coefs_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                for (pdVar17 = (__return_storage_ptr__->coefs_).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start; pdVar17 != pdVar7;
                    pdVar17 = pdVar17 + 1) {
                  dVar2 = *pdVar17;
                  if (dVar2 < 0.0) {
                    dVar2 = sqrt(dVar2);
                  }
                  else {
                    dVar2 = SQRT(dVar2);
                  }
                  *pdVar17 = dVar2;
                }
                QuadTerms::unfold_if_need(local_38);
                local_68.data_ = *(double **)(lVar16 + 0x180);
                local_68.size_ = *(size_t *)(lVar16 + 400);
                local_68.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_68.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_68.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ArrayRef<int>::move_or_copy
                          ((vector<int,_std::allocator<int>_> *)&local_88,(ArrayRef<int> *)&local_68
                          );
                piVar8 = (__return_storage_ptr__->vars_).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar9 = (__return_storage_ptr__->vars_).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
                (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     (pointer)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage;
                local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if ((piVar8 != (pointer)0x0) &&
                   (operator_delete(piVar8,(long)piVar9 - (long)piVar8),
                   local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0)) {
                  operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_88.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_88.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_68.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_68.save_.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_68.save_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_68.save_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                __return_storage_ptr__->const_term = *(double *)(lVar16 + 0x1e0);
                local_68.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar3,res_var);
                std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                          ((vector<int,std::allocator<int>> *)
                           &__return_storage_ptr__->res_vars_to_delete_,&local_68);
                return __return_storage_ptr__;
              }
              ppVar4 = (this_00->folded_).
                       super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                       .m_data.
                       super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                       .m_data_ptr;
              pdVar17 = (double *)((long)&ppVar4->second + (lVar15 >> 0x1c));
            } while ((0.0 < *pdVar17 || *pdVar17 == 0.0) &&
                    (lVar10 = lVar14 + -4, piVar1 = (int *)((long)&(ppVar4->first).first + lVar14),
                    lVar14 = lVar14 + -0x10, *(int *)((long)ppVar4 + lVar10) == *piVar1));
          }
        }
      }
    }
  }
  __return_storage_ptr__->is_from_abs_ = false;
  (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->const_term = 0.0;
  __return_storage_ptr__->coef_extra = 0.0;
  (__return_storage_ptr__->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->res_vars_to_delete_).super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

ConeArgs CheckNorm2_Pow(const ConInfo& ci, int res_var) {
    const auto& con_pow = MC().template
        GetConstraint<PowConstExpConstraint>(ci);
    const auto arg_pow = con_pow.GetArguments()[0];
    if (0.5 == con_pow.GetParameters()[0] &&     // sqrt(arg_pow)
        MC().HasInitExpression(arg_pow)) {
      const auto& ie_pow = MC().GetInitExpression(arg_pow);
      if (MC().template                          // arg_pow := QFC(...)
          IsConInfoType<QuadraticFunctionalConstraint>(ie_pow)) {
        const auto& con_qdc = MC().template
            GetConstraint<QuadraticFunctionalConstraint>(ie_pow);
        const auto& args_qdc = con_qdc.GetArguments();
        // Allowing a nonneg constant term by adding
        // an auxiliary variable^2
        if (0.0 <= args_qdc.constant_term() &&
            args_qdc.GetBody().GetLinTerms().empty()) {
          const auto& qpterms = args_qdc.GetBody().GetQPTerms();
          for (auto i=qpterms.size(); i--; ) {
            if (qpterms.coef(i) < 0.0 ||
                qpterms.var1(i) != qpterms.var2(i))
              return {};
          }
          ConeArgs result;
          result.coefs_ = qpterms.coefs();
          for (auto& c: result.coefs_)
            c = std::sqrt(c);
          result.vars_ = qpterms.vars1();
          result.const_term = args_qdc.constant_term();
          result.res_vars_to_delete_ = { res_var, arg_pow };
          return result;
        }
      }
    }
    return {};
  }